

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_cout_write.cpp
# Opt level: O0

void use_io_manipulate(void)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  _Setprecision _Var3;
  void *this;
  ostream *poVar4;
  double dVar5;
  int local_24;
  int n;
  double root;
  
  this = (void *)std::ostream::operator<<(&std::cout,std::fixed);
  std::ostream::operator<<(this,std::right);
  _Var2 = std::setw(6);
  poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar4 = std::operator<<(poVar4,"N");
  _Var2 = std::setw(0xe);
  poVar4 = std::operator<<(poVar4,_Var2);
  poVar4 = std::operator<<(poVar4,"sqrt root");
  _Var2 = std::setw(0xf);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::operator<<(poVar4,"fourth root\n");
  for (local_24 = 0; local_24 < 0x65; local_24 = local_24 + 10) {
    dVar5 = sqrt((double)local_24);
    _Var2 = std::setw(6);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
    _Var1 = std::setfill<char>('.');
    poVar4 = std::operator<<(poVar4,_Var1._M_c);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
    _Var2 = std::setw(0xe);
    poVar4 = std::operator<<(poVar4,_Var2);
    _Var1 = std::setfill<char>(' ');
    poVar4 = std::operator<<(poVar4,_Var1._M_c);
    _Var3 = std::setprecision(3);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    _Var2 = std::setw(0xe);
    poVar4 = std::operator<<(poVar4,_Var2);
    _Var3 = std::setprecision(3);
    poVar4 = std::operator<<(poVar4,_Var3);
    dVar5 = sqrt(dVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    std::operator<<(poVar4,"\n");
  }
  return;
}

Assistant:

void use_io_manipulate() {
    using namespace std;

    cout << fixed << right;
    cout << setw(6) << "N" << setw(14) << "sqrt root" << setw(15) << "fourth root\n";

    double root;
    for(int n = 0; n <= 100; n+= 10) {
        root = sqrt(double(n));
        cout << setw(6) << setfill('.') << n
            << setw(14) << setfill(' ') << setprecision(3) << root
            << setw(14) << setprecision(3) << sqrt(root) << "\n";
    }
}